

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O0

void predict_or_learn<true>(autolink *b,single_learner *base,example *ec)

{
  v_array<unsigned_char> *in_RDX;
  uint *in_RDI;
  float fVar1;
  size_t i;
  features *fs;
  float base_pred;
  uchar *in_stack_ffffffffffffffc8;
  v_array<unsigned_char> *in_stack_ffffffffffffffd0;
  features *this;
  example *in_stack_ffffffffffffffd8;
  example *ec_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  fVar1 = *(float *)&in_RDX[0x342].end_array;
  v_array<unsigned_char>::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ec_00 = (example *)&in_RDX[0x1a7].end_array;
  for (this = (features *)0x0; this < (features *)(ulong)*in_RDI;
      this = (features *)((long)&(this->values)._begin + 1)) {
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      features::push_back((features *)CONCAT44(fVar1,in_stack_ffffffffffffffe0),
                          (feature_value)((ulong)ec_00 >> 0x20),(feature_index)this);
      fVar1 = *(float *)&in_RDX[0x342].end_array * fVar1;
    }
  }
  *(float *)((long)&in_RDX[0x345].end_array + 4) =
       *(float *)&(ec_00->super_example_predict).feature_space[0].space_names._begin +
       *(float *)((long)&in_RDX[0x345].end_array + 4);
  LEARNER::learner<char,_example>::learn
            ((learner<char,_example> *)CONCAT44(fVar1,in_stack_ffffffffffffffe0),ec_00,(size_t)this)
  ;
  *(float *)((long)&in_RDX[0x345].end_array + 4) =
       *(float *)((long)&in_RDX[0x345].end_array + 4) -
       *(float *)&(ec_00->super_example_predict).feature_space[0].space_names._begin;
  features::clear(this);
  v_array<unsigned_char>::pop(in_RDX);
  return;
}

Assistant:

void predict_or_learn(autolink& b, LEARNER::single_learner& base, example& ec)
{
  base.predict(ec);
  float base_pred = ec.pred.scalar;
  // add features of label
  ec.indices.push_back(autolink_namespace);
  features& fs = ec.feature_space[autolink_namespace];
  for (size_t i = 0; i < b.d; i++)
    if (base_pred != 0.)
    {
      fs.push_back(base_pred, autoconstant + (i << b.stride_shift));
      base_pred *= ec.pred.scalar;
    }
  ec.total_sum_feat_sq += fs.sum_feat_sq;

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  ec.total_sum_feat_sq -= fs.sum_feat_sq;
  fs.clear();
  ec.indices.pop();
}